

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O2

CScriptNum * __thiscall CScriptNum::operator+=(CScriptNum *this,int64_t *rhs)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *rhs;
  if (lVar2 == 0) {
    lVar3 = this->m_value;
  }
  else {
    lVar3 = this->m_value;
    if (lVar2 < 1) {
      if (lVar3 < -0x8000000000000000 - lVar2) goto LAB_0064ea50;
    }
    else if (0x7fffffffffffffff - lVar2 < lVar3) {
LAB_0064ea50:
      __assert_fail("rhs == 0 || (rhs > 0 && m_value <= std::numeric_limits<int64_t>::max() - rhs) || (rhs < 0 && m_value >= std::numeric_limits<int64_t>::min() - rhs)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/script.h"
                    ,0x139,"CScriptNum &CScriptNum::operator+=(const int64_t &)");
    }
  }
  this->m_value = lVar3 + lVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

inline CScriptNum& operator+=( const int64_t& rhs)
    {
        assert(rhs == 0 || (rhs > 0 && m_value <= std::numeric_limits<int64_t>::max() - rhs) ||
                           (rhs < 0 && m_value >= std::numeric_limits<int64_t>::min() - rhs));
        m_value += rhs;
        return *this;
    }